

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

UINT8 __thiscall
PlayerA::PlayCallback(PlayerA *this,PlayerBase *player,UINT8 evtType,void *evtParam)

{
  uint uVar1;
  UINT32 UVar2;
  UINT32 *curLoop;
  UINT8 retVal;
  void *evtParam_local;
  UINT8 evtType_local;
  PlayerBase *player_local;
  PlayerA *this_local;
  
  curLoop._7_1_ = '\0';
  if (evtType != '\x04') {
    if (this->_plrCbFunc != (PLAYER_EVENT_CB)0x0) {
      curLoop._7_1_ = (*this->_plrCbFunc)(player,this->_plrCbParam,evtType,evtParam);
    }
    if (curLoop._7_1_ != '\0') {
      return curLoop._7_1_;
    }
  }
  uVar1 = (uint)evtType;
  if (1 < uVar1 - 1) {
    if (uVar1 == 3) {
      if (((this->_config).loopCount != 0) && ((this->_config).loopCount <= *evtParam)) {
        FadeOut(this);
      }
    }
    else if (uVar1 == 4) {
      this->_myPlayState = this->_myPlayState | 2;
      UVar2 = (*player->_vptr_PlayerBase[0x1a])(player,2);
      this->_endSilenceStart = UVar2;
    }
  }
  return '\0';
}

Assistant:

UINT8 PlayerA::PlayCallback(PlayerBase* player, UINT8 evtType, void* evtParam)
{
	UINT8 retVal = 0x00;
	
	if (evtType != PLREVT_END)	// We will generate our own PLREVT_END event depending on fading/endSilence.
	{
		if (_plrCbFunc != NULL)
			retVal = _plrCbFunc(player, _plrCbParam, evtType, evtParam);
		if (retVal)
			return retVal;
	}
	
	switch(evtType)
	{
	case PLREVT_START:
	case PLREVT_STOP:
		break;
	case PLREVT_LOOP:
		{
			UINT32* curLoop = (UINT32*)evtParam;
			if (_config.loopCount > 0 && *curLoop >= _config.loopCount)
			{
				//if (_config.fadeSmpls == 0)
				//	return 0x01;	// send "stop" signal to player engine
				FadeOut();
			}
		}
		break;
	case PLREVT_END:
		_myPlayState |= PLAYSTATE_END;
		_endSilenceStart = player->GetCurPos(PLAYPOS_SAMPLE);
		break;
	}
	return 0x00;
}